

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toms917.cpp
# Opt level: O2

int wrightomega_ext(complex<double> z,complex<double> *w,complex<double> *e,complex<double> *r,
                   complex<double> *cond)

{
  bool bVar1;
  bool bVar2;
  complex<double> *pcVar3;
  double *pdVar4;
  complex<double> *__z;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double dVar5;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  double extraout_XMM0_Qa_25;
  double extraout_XMM0_Qa_26;
  double extraout_XMM0_Qa_27;
  double extraout_XMM0_Qa_28;
  double extraout_XMM0_Qa_29;
  double extraout_XMM0_Qa_30;
  double extraout_XMM0_Qa_31;
  double extraout_XMM0_Qa_32;
  double extraout_XMM0_Qa_33;
  double extraout_XMM0_Qa_34;
  double extraout_XMM0_Qa_35;
  double extraout_XMM0_Qa_36;
  double extraout_XMM0_Qa_37;
  double extraout_XMM0_Qa_38;
  double extraout_XMM0_Qa_39;
  double extraout_XMM0_Qa_40;
  undefined8 extraout_XMM0_Qa_41;
  double extraout_XMM0_Qa_42;
  double extraout_XMM0_Qa_43;
  double extraout_XMM0_Qa_44;
  double extraout_XMM0_Qa_45;
  undefined8 extraout_XMM0_Qa_46;
  double in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 local_178 [16];
  double local_168;
  double dStack_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double dStack_120;
  complex<double> *local_110;
  double local_108;
  double local_100;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_d8;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  complex<double> z_local;
  double local_40;
  double dStack_38;
  
  pdVar4 = z._M_value._8_8_;
  __z = z._M_value._0_8_;
  local_f8 = 0.0;
  dStack_f0 = 0.0;
  local_128 = 0.0;
  dStack_120 = 0.0;
  local_168 = 0.0;
  dStack_160 = 0.0;
  if ((NAN(in_XMM0_Qa)) || (NAN(in_XMM1_Qa))) {
    *(undefined8 *)__z->_M_value = 0x7ff8000000000000;
    *(undefined8 *)(__z->_M_value + 8) = 0x7ff8000000000000;
LAB_001d03b0:
    *pdVar4 = 0.0;
    pdVar4[1] = 0.0;
    *(undefined8 *)w->_M_value = 0;
    *(undefined8 *)(w->_M_value + 8) = 0;
    return 0;
  }
  if ((((in_XMM1_Qa <= 3.141592653589793) && (-3.141592653589793 < in_XMM1_Qa)) &&
      (in_XMM0_Qa < 0.0)) && (ABS(in_XMM0_Qa) == INFINITY)) {
    *(undefined8 *)__z->_M_value = 0;
    *(undefined8 *)(__z->_M_value + 8) = 0;
    goto LAB_001d03b0;
  }
  if ((ABS(in_XMM0_Qa) == INFINITY) || (ABS(in_XMM1_Qa) == INFINITY)) {
    *(double *)__z->_M_value = in_XMM0_Qa;
    *(double *)(__z->_M_value + 8) = in_XMM1_Qa;
    goto LAB_001d03b0;
  }
  dVar6 = ABS(in_XMM1_Qa);
  if (((in_XMM0_Qa == -1.0) && (!NAN(in_XMM0_Qa))) &&
     ((dVar6 == 3.141592653589793 && (!NAN(dVar6))))) {
    *(undefined8 *)__z->_M_value = 0xbff0000000000000;
    *(undefined8 *)(__z->_M_value + 8) = 0;
    goto LAB_001d03b0;
  }
  dVar8 = in_XMM1_Qa + -3.141592653589793;
  dVar7 = in_XMM1_Qa + 3.141592653589793;
  bVar2 = in_XMM0_Qa <= 1.0;
  bVar1 = -2.0 < in_XMM0_Qa;
  local_110 = e;
  local_e8 = in_XMM0_Qa;
  local_98 = in_XMM0_Qa;
  z_local._M_value._0_8_ = in_XMM1_Qa;
  if (((!bVar1 || !bVar2) || (in_XMM1_Qa <= 1.0)) || (6.283185307179586 <= in_XMM1_Qa)) {
    if (((!bVar1 || !bVar2) || (in_XMM1_Qa <= -6.283185307179586)) || (-1.0 <= in_XMM1_Qa)) {
      if (((3.141592653589793 < in_XMM1_Qa) || (-2.0 < in_XMM0_Qa)) ||
         (in_XMM1_Qa <= -3.141592653589793)) {
        if ((!(bool)(~(bVar1 && bVar2) & 1U | 1.0 < dVar6)) ||
           ((-2.0 < in_XMM0_Qa &&
            ((in_XMM0_Qa + -1.0) * (in_XMM0_Qa + -1.0) + in_XMM1_Qa * in_XMM1_Qa <=
             9.869604401089358)))) {
          local_f8 = in_XMM0_Qa + -1.0;
          local_a8 = in_XMM1_Qa * 0.5;
          local_d8 = in_XMM0_Qa * 0.5 + 0.5;
          local_b8 = local_f8 * 0.00021158854166666667 + -0.0003255208333333333;
          dVar6 = in_XMM1_Qa * 0.00021158854166666667;
          dStack_f0 = in_XMM1_Qa;
          local_b0 = dVar6;
          uStack_a0 = in_XMM1_Qb;
          std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_f8);
          local_c8 = extraout_XMM0_Qa_15 + -0.005208333333333333;
          local_c0 = dVar6;
          std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_f8);
          z_local._M_value._8_8_ = extraout_XMM0_Qa_16 + 0.0625;
          std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_f8);
          local_40 = extraout_XMM0_Qa_17;
          dStack_38 = dVar6;
          std::operator*((complex<double> *)&local_40,(complex<double> *)&local_f8);
          dVar5 = extraout_XMM0_Qa_18 + local_d8;
          dVar6 = dVar6 + local_a8;
        }
        else {
          dVar6 = in_XMM1_Qa;
          if ((((in_XMM0_Qa <= -1.05) && (3.141592653589793 < in_XMM1_Qa)) &&
              (dVar6 = (in_XMM0_Qa + 1.0) * -0.75, dVar5 = dVar8, dVar8 <= dVar6)) ||
             (((in_XMM0_Qa <= -1.05 && (dVar6 = dVar7, (in_XMM0_Qa + 1.0) * 0.75 < dVar7)) &&
              (dVar5 = dVar7, dVar7 <= 0.0)))) {
            dStack_120 = dVar5;
            local_40 = -in_XMM0_Qa;
            dStack_38 = -dStack_120;
            local_128 = in_XMM0_Qa;
            std::log<double>((complex<double> *)&local_40);
            local_c8 = extraout_XMM0_Qa_26 * 0.3333333333333333 + -1.5;
            dVar5 = dVar6 * 0.3333333333333333;
            local_f8 = extraout_XMM0_Qa_26;
            dStack_f0 = dVar6;
            local_c0 = dVar5;
            std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_f8);
            z_local._M_value._8_8_ = extraout_XMM0_Qa_27 + 1.0;
            std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_f8);
            local_100 = dStack_f0 * 0.5;
            local_108 = local_f8 * 0.5 + -1.0;
            local_d8 = dVar5;
            local_a8 = extraout_XMM0_Qa_28;
            std::operator*((complex<double> *)&local_108,(complex<double> *)&local_f8);
            local_148 = local_128 - local_f8;
            local_140 = dStack_120 - dStack_f0;
            dVar6 = dVar5;
            std::operator*((complex<double> *)&local_148,(complex<double> *)&local_128);
            local_158 = extraout_XMM0_Qa_30 + local_f8;
            dVar6 = dVar6 + dStack_f0;
            local_150 = dVar6;
            std::operator*((complex<double> *)&local_158,(complex<double> *)&local_128);
            local_b8 = extraout_XMM0_Qa_31 + extraout_XMM0_Qa_29;
            dVar6 = dVar6 + dVar5;
            local_b0 = dVar6;
            std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_128);
            local_40 = extraout_XMM0_Qa_32 + local_a8;
            dVar6 = dVar6 + local_d8;
            dStack_38 = dVar6;
            std::operator*((complex<double> *)&local_128,(complex<double> *)&local_128);
            local_178._8_8_ = dVar6;
            std::operator*((complex<double> *)local_178,(complex<double> *)&local_128);
          }
          else {
            std::log<double>((complex<double> *)&local_98);
            local_c8 = extraout_XMM0_Qa_19 * 0.3333333333333333 + -1.5;
            dVar5 = dVar6 * 0.3333333333333333;
            local_f8 = extraout_XMM0_Qa_19;
            dStack_f0 = dVar6;
            local_c0 = dVar5;
            std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_f8);
            z_local._M_value._8_8_ = extraout_XMM0_Qa_20 + 1.0;
            std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_f8);
            local_100 = dStack_f0 * 0.5;
            local_108 = local_f8 * 0.5 + -1.0;
            local_d8 = dVar5;
            local_a8 = extraout_XMM0_Qa_21;
            std::operator*((complex<double> *)&local_108,(complex<double> *)&local_f8);
            local_148 = local_98 - local_f8;
            local_140 = (double)z_local._M_value._0_8_ - dStack_f0;
            dVar6 = dVar5;
            std::operator*((complex<double> *)&local_148,(complex<double> *)&local_98);
            local_158 = extraout_XMM0_Qa_23 + local_f8;
            dVar6 = dVar6 + dStack_f0;
            local_150 = dVar6;
            std::operator*((complex<double> *)&local_158,(complex<double> *)&local_98);
            local_b8 = extraout_XMM0_Qa_24 + extraout_XMM0_Qa_22;
            dVar6 = dVar6 + dVar5;
            local_b0 = dVar6;
            std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_98);
            local_40 = extraout_XMM0_Qa_25 + local_a8;
            dVar6 = dVar6 + local_d8;
            dStack_38 = dVar6;
            std::operator*((complex<double> *)&local_98,(complex<double> *)&local_98);
            local_178._8_8_ = dVar6;
            std::operator*((complex<double> *)local_178,(complex<double> *)&local_98);
          }
          local_130 = dVar6;
          std::operator/((complex<double> *)&local_40,(complex<double> *)&local_138);
          dVar5 = extraout_XMM0_Qa_33;
        }
      }
      else {
        std::exp<double>((complex<double> *)&local_98);
        local_b8 = extraout_XMM0_Qa_10 * 5.208333333333333 + -2.6666666666666665;
        dVar6 = in_XMM1_Qa * 5.208333333333333;
        local_f8 = extraout_XMM0_Qa_10;
        dStack_f0 = in_XMM1_Qa;
        local_b0 = dVar6;
        std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_f8);
        local_c8 = extraout_XMM0_Qa_11 + 1.5;
        local_c0 = dVar6;
        std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_f8);
        z_local._M_value._8_8_ = extraout_XMM0_Qa_12 + -1.0;
        std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_f8);
        local_40 = extraout_XMM0_Qa_13 + 1.0;
        dStack_38 = dVar6;
        std::operator*((complex<double> *)&local_40,(complex<double> *)&local_f8);
        dVar5 = extraout_XMM0_Qa_14;
      }
      goto LAB_001d0c78;
    }
    local_40 = in_XMM0_Qa + 1.0 + in_XMM0_Qa + 1.0;
    dVar6 = dVar7 * -2.0;
    dStack_38 = dVar6;
    std::sqrt<double>((complex<double> *)&local_40);
    dVar6 = -dVar6;
    local_108 = 0.0;
    local_100 = 0.0002314814814814815;
    local_f8 = extraout_XMM0_Qa_05;
    dStack_f0 = dVar6;
    std::operator*((complex<double> *)&local_108,(complex<double> *)&local_f8);
    dVar6 = -dVar6;
    local_b8 = 0.003703703703703704 - extraout_XMM0_Qa_06;
    local_b0 = dVar6;
    std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_f8);
    dVar6 = dVar6 + 0.027777777777777776;
    local_c8 = extraout_XMM0_Qa_07 + 0.0;
    local_c0 = dVar6;
    std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_f8);
    z_local._M_value._8_8_ = extraout_XMM0_Qa_08 + 0.3333333333333333;
    std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_f8);
    dVar6 = dVar6 + -1.0;
    local_40 = extraout_XMM0_Qa_09;
  }
  else {
    local_40 = in_XMM0_Qa + 1.0 + in_XMM0_Qa + 1.0;
    dVar6 = dVar8 * -2.0;
    dStack_38 = dVar6;
    std::sqrt<double>((complex<double> *)&local_40);
    dVar6 = -dVar6;
    local_108 = 0.0;
    local_100 = 0.0002314814814814815;
    local_f8 = extraout_XMM0_Qa;
    dStack_f0 = dVar6;
    std::operator*((complex<double> *)&local_108,(complex<double> *)&local_f8);
    local_b8 = extraout_XMM0_Qa_00 + 0.003703703703703704;
    local_b0 = dVar6;
    std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_f8);
    dVar6 = dVar6 + -0.027777777777777776;
    local_c8 = extraout_XMM0_Qa_01;
    local_c0 = dVar6;
    std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_f8);
    z_local._M_value._8_8_ = extraout_XMM0_Qa_02 + 0.3333333333333333;
    std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_f8);
    local_40 = extraout_XMM0_Qa_03 + 0.0;
    dVar6 = dVar6 + 1.0;
  }
  dStack_38 = dVar6;
  std::operator*((complex<double> *)&local_40,(complex<double> *)&local_f8);
  dVar5 = extraout_XMM0_Qa_04 + -1.0;
LAB_001d0c78:
  *(double *)__z->_M_value = dVar5;
  *(double *)(__z->_M_value + 8) = dVar6;
  dVar6 = 1.0;
  if (local_e8 <= -0.99) {
    if ((ABS(dVar8) <= 0.01) || (dVar6 = 1.0, ABS(dVar7) <= 0.01)) {
      local_a8 = ABS(dVar8);
      uStack_a0 = 0;
      fesetround(0x800);
      if (0.01 < local_a8) {
        dVar8 = dVar7;
      }
      if (dVar8 <= 0.0) {
        fesetround(0x400);
      }
      local_98 = local_e8;
      z_local._M_value._0_8_ = dVar8;
      fesetround(0);
      dVar6 = -1.0;
    }
  }
  dVar8 = *(double *)__z->_M_value * dVar6;
  dVar7 = *(double *)(__z->_M_value + 8) * dVar6;
  *(double *)__z->_M_value = dVar8;
  *(double *)(__z->_M_value + 8) = dVar7;
  dVar7 = dVar7 * dVar6;
  dVar5 = local_98 - dVar8 * dVar6;
  dVar8 = (double)z_local._M_value._0_8_ - dVar7;
  local_e8 = dVar6;
  std::log<double>(__z);
  *(double *)w->_M_value = dVar5 - extraout_XMM0_Qa_34;
  *(double *)(w->_M_value + 8) = dVar8 - dVar7;
  dStack_160 = *(double *)(__z->_M_value + 8) * local_e8;
  local_168 = *(double *)__z->_M_value * local_e8 + 1.0;
  std::operator/(w,(complex<double> *)&local_168);
  local_b8 = local_168 + local_168;
  local_b0 = dStack_160 + dStack_160;
  local_108 = *(double *)w->_M_value * 0.6666666666666666 + local_168;
  local_100 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dStack_160;
  dVar6 = dStack_160;
  std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_108);
  local_c8 = extraout_XMM0_Qa_35 - *(double *)w->_M_value;
  dVar6 = dVar6 - *(double *)(w->_M_value + 8);
  local_c0 = dVar6;
  std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_c8);
  local_148 = local_168 + local_168;
  local_140 = dStack_160 + dStack_160;
  local_138 = *(double *)w->_M_value * 0.6666666666666666 + local_168;
  local_130 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dStack_160;
  dVar7 = dStack_160;
  dStack_38 = dVar6;
  std::operator*((complex<double> *)&local_148,(complex<double> *)&local_138);
  local_158 = extraout_XMM0_Qa_36 - (*(double *)w->_M_value + *(double *)w->_M_value);
  dVar7 = dVar7 - (*(double *)(w->_M_value + 8) + *(double *)(w->_M_value + 8));
  local_150 = dVar7;
  std::operator/((complex<double> *)&local_40,(complex<double> *)&local_158);
  *pdVar4 = extraout_XMM0_Qa_37;
  pdVar4[1] = dVar7;
  local_40 = extraout_XMM0_Qa_37 + 1.0;
  dStack_38 = dVar7;
  std::operator*(__z,(complex<double> *)&local_40);
  *(double *)__z->_M_value = extraout_XMM0_Qa_38;
  *(double *)(__z->_M_value + 8) = dVar7;
  z_local._M_value._8_8_ = extraout_XMM0_Qa_38 + extraout_XMM0_Qa_38;
  dVar7 = dVar7 + dVar7;
  std::operator*((complex<double> *)(z_local._M_value + 8),__z);
  dVar6 = *(double *)__z->_M_value;
  dVar8 = *(double *)(__z->_M_value + 8);
  dVar5 = std::abs<double>(w);
  dStack_38 = pow(dVar5,4.0);
  local_40 = ((extraout_XMM0_Qa_39 - dVar6 * 8.0) + -1.0) * dStack_38;
  dStack_38 = (dVar7 - dVar8 * 8.0) * dStack_38;
  dVar7 = std::abs<double>((complex<double> *)&local_40);
  dVar6 = std::abs<double>((complex<double> *)&local_168);
  dVar5 = pow(dVar6,6.0);
  dVar6 = *(double *)__z->_M_value;
  dVar8 = *(double *)(__z->_M_value + 8);
  if (dVar5 * 1.5987211554602254e-14 <= dVar7) {
    dVar8 = dVar8 * local_e8;
    dVar7 = local_98 - dVar6 * local_e8;
    dVar6 = (double)z_local._M_value._0_8_ - dVar8;
    std::log<double>(__z);
    *(double *)w->_M_value = dVar7 - extraout_XMM0_Qa_40;
    *(double *)(w->_M_value + 8) = dVar6 - dVar8;
    dStack_160 = *(double *)(__z->_M_value + 8) * local_e8;
    local_168 = *(double *)__z->_M_value * local_e8 + 1.0;
    std::operator/(w,(complex<double> *)&local_168);
    local_b8 = local_168 + local_168;
    local_b0 = dStack_160 + dStack_160;
    local_108 = *(double *)w->_M_value * 0.6666666666666666 + local_168;
    local_100 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dStack_160;
    dVar6 = dStack_160;
    z_local._M_value._8_8_ = extraout_XMM0_Qa_41;
    std::operator*((complex<double> *)&local_b8,(complex<double> *)&local_108);
    local_c8 = extraout_XMM0_Qa_42 - *(double *)w->_M_value;
    dVar6 = dVar6 - *(double *)(w->_M_value + 8);
    local_c0 = dVar6;
    std::operator*((complex<double> *)(z_local._M_value + 8),(complex<double> *)&local_c8);
    local_148 = local_168 + local_168;
    local_140 = dStack_160 + dStack_160;
    local_138 = *(double *)w->_M_value * 0.6666666666666666 + local_168;
    local_130 = *(double *)(w->_M_value + 8) * 0.6666666666666666 + dStack_160;
    dVar8 = dStack_160;
    dStack_38 = dVar6;
    std::operator*((complex<double> *)&local_148,(complex<double> *)&local_138);
    local_158 = extraout_XMM0_Qa_43 - (*(double *)w->_M_value + *(double *)w->_M_value);
    dVar8 = dVar8 - (*(double *)(w->_M_value + 8) + *(double *)(w->_M_value + 8));
    local_150 = dVar8;
    std::operator/((complex<double> *)&local_40,(complex<double> *)&local_158);
    *pdVar4 = extraout_XMM0_Qa_44;
    pdVar4[1] = dVar8;
    local_40 = extraout_XMM0_Qa_44 + 1.0;
    dStack_38 = dVar8;
    std::operator*(__z,(complex<double> *)&local_40);
    dVar6 = extraout_XMM0_Qa_45;
  }
  pcVar3 = local_110;
  dVar8 = dVar8 * local_e8;
  *(double *)__z->_M_value = dVar6 * local_e8;
  local_40 = dVar6 * local_e8 + 1.0;
  *(double *)(__z->_M_value + 8) = dVar8;
  dStack_38 = dVar8;
  std::operator/((complex<double> *)&local_98,(complex<double> *)&local_40);
  *(undefined8 *)pcVar3->_M_value = extraout_XMM0_Qa_46;
  *(double *)(pcVar3->_M_value + 8) = dVar8;
  return 0;
}

Assistant:

int wrightomega_ext ( std::complex <double> z, std::complex <double> &w, 
  std::complex <double> &e, std::complex <double> &r, std::complex <double> &cond )

//****************************************************************************80
//
//  Purpose:
//
//    WRIGHTOMEGA_EXT computes the Wright Omega function with extra information.
//
//  Discussion:
//
//    WRIGHTOMEGA_EXT is the extended routine for evaluating the Wright
//    Omega function with the option of extracting the last update step,
//    the penultimate residual and the condition number estimate.
//
//  Modified:
//
//    14 May 2016
//
//  Author:
//
//    Piers Lawrence, Robert Corless, David Jeffrey
//
//  Reference:
//
//    Piers Lawrence, Robert Corless, David Jeffrey,
//    Algorithm 917: Complex Double-Precision Evaluation of the Wright Omega 
//    Function,
//    ACM Transactions on Mathematical Software,
//    Volume 38, Number 3, Article 20, April 2012, 17 pages.
//
//  Parameters:
//
//    Input, complex <double> Z, value at which to evaluate Wrightomega().
//
//    Output, complex <double> &W, the value of Wrightomega(z).
//
//    Output, complex <double> &E, the last update step in the iterative scheme.
//
//    Output, complex <double> &R, the penultimate residual,
//    r_k = z - w_k - log(w_k)
//
//    Output, complex <double> &COND, the condition number estimate. 
//
//    Output, int WRIGHTOMEGA_EXT, error flag;
//    0, successful computation.
//    nonzero, the computation failed.        
//
{
  double near;
  double pi = 3.1415926535897932384626433832795029;//M_PI;
  std::complex <double> pz;
  double s = 1.0;
  std::complex <double> t;
  std::complex <double> wp1;
  double x;
  double y;
  double ympi;
  double yppi;
// 
//  Extract real and imaginary parts of Z. 
//
  x = std::real ( z );
  y = std::imag ( z );
// 
//  Compute if we are near the branch cuts.
//
  ympi = y - pi;
  yppi = y + pi;
  near = 0.01;
// 
//  Test for floating point exceptions:
//

//
//  NaN output for NaN input.
//
  if ( std::isnan ( x ) || std::isnan ( y ) )
  {
    w = std::complex <double> ( ( 0.0 / 0.0 ), ( 0.0 / 0.0 ) );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Signed zeros between branches.
//
  else if ( std::isinf ( x ) && ( x < 0.0 ) && ( - pi < y ) && ( y <= pi ) )
  {
    if ( fabs ( y ) <= pi / 2.0 )
    {
      w = + 0.0;
    }
    else
    {
      w = - 0.0;
    }
      
    if ( 0.0 <= y )
    {
      w = w + std::complex <double> ( 0.0, 0.0 );
    }
    else
    {
      w = w + std::complex <double> ( 0.0, - 1.0 * 0.0 );
    }

    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Asymptotic for large z.
//
  else if ( std::isinf ( x ) || std::isinf ( y ) )
  {
    w = std::complex <double> ( x, y );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
//
//  Test if exactly on the singular points.
//
  if ( ( x == - 1.0 ) && ( fabs ( y ) == pi ) )
  {
    w = std::complex <double> ( - 1.0, 0.0 );
    e = std::complex <double> ( 0.0, 0.0 );
    r = std::complex <double> ( 0.0, 0.0 );
    return 0;
  }
// 
//  Choose approximation based on region.
//

//
//  Region 1: upper branch point.
//  Series about z=-1+Pi*I.
//
  if ( ( - 2.0 < x && x <= 1.0 && 1.0 < y && y < 2.0 * pi ) )
  {
    pz = conj ( sqrt ( conj ( 2.0 * ( z + std::complex <double> ( 1.0, - pi ) ) ) ) );

    w = - 1.0 
      + ( std::complex <double> ( 0.0, 1.0 )
      + ( 1.0 / 3.0 
      + ( - 1.0 / 36.0 * std::complex <double> ( 0.0, 1.0 ) 
      + ( 1.0 / 270.0 + 1.0 / 4320.0 * std::complex <double> ( 0.0, 1.0 ) * pz ) 
      * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 2: lower branch point.
//  Series about z=-1-Pi*I.
//
  else if ( ( - 2.0 < x && x <= 1.0 && - 2.0 * pi < y && y <- 1.0 ) )
  {
    pz = conj ( sqrt ( conj ( 2.0 * ( z + 1.0 + std::complex <double> ( 0.0, pi ) ) ) ) );

    w = - 1.0 
      + ( - std::complex <double> ( 0.0, 1.0 ) + ( 1.0 / 3.0 
      + ( 1.0 / 36.0 * std::complex <double> ( 0.0, 1.0 )
      + ( 1.0 / 270.0 - 1.0 / 4320.0 * std::complex <double> ( 0.0, 1.0 ) * pz ) 
      * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 3: between branch cuts.
//  Series: About -infinity.
//
  else if ( x <= - 2.0 && - pi < y && y <= pi )
  {
    pz = exp ( z );
    w = ( 1.0 
      + ( - 1.0 
      + ( 3.0 / 2.0 
      + ( - 8.0 / 3.0 
      + 125.0 / 24.0 * pz ) * pz ) * pz ) * pz ) * pz;
  }
//
//  Region 4: Mushroom.
//  Series about z=1.
//
  else if ( ( ( - 2.0 < x ) && ( x <= 1.0 ) && ( - 1.0 <= y ) && ( y <= 1.0 ) )
    || ( ( - 2.0 < x ) && ( x - 1.0 ) * ( x - 1.0 ) + y * y <= pi * pi ) )
  {
    pz = z - 1.0;
    w = 1.0 / 2.0 + 1.0 / 2.0 * z 
      + ( 1.0 / 16.0 
      + ( - 1.0 / 192.0 
      + ( - 1.0 / 3072.0 + 13.0 / 61440.0 * pz ) * pz ) * pz ) * pz * pz;
  }
//
//  Region 5: Top wing.
//  Negative log series.
//
  else if ( x <= - 1.05 && pi < y && y - pi <= - 0.75 * ( x + 1.0 ) )
  {
    t = z - std::complex <double> ( 0.0, pi );
    pz = log ( - t );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz 
      + ( ( -1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + t ) * t ) * t ) * t ) 
      / ( t * t * t );
  }
//
//  Region 6: Bottom wing.
//  Negative log series.
//
  else if ( x <= - 1.05 && 0.75 * ( x + 1.0 ) < y + pi && y + pi <= 0.0 )
  {
    t = z + std::complex <double> ( 0.0, pi );
    pz = log ( - t );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz
      + ( ( - 1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + t ) * t ) * t ) * t ) 
      / ( t * t * t );
  }
//
//  Region 7: Everywhere else.
//  Series solution about infinity.
//
  else
  {
    pz = log ( z );
    w = ( ( 1.0 + ( - 3.0 / 2.0 + 1.0 / 3.0 * pz ) * pz ) * pz 
      + ( ( - 1.0 + 1.0 / 2.0 * pz ) * pz + ( pz + ( - pz + z ) * z ) * z ) * z ) 
      / ( z * z * z );
  }
//
//  Regularize if near branch cuts.
///
  if ( x <= - 1.0 + near && ( fabs ( ympi ) <= near || fabs ( yppi ) <= near ) ) 
  { 
    s = - 1.0;
    if ( fabs ( ympi ) <= near )
    {
//
//  Recompute ympi with directed rounding.
//
      fesetround ( FE_UPWARD );
      ympi = y - pi;
          
      if ( ympi <= 0.0 )
      {
        fesetround ( FE_DOWNWARD );
        ympi = y - pi;
      }
         
      z = std::complex <double> ( x, ympi ); 
// 
//  Return rounding to default.
//
      fesetround ( FE_TONEAREST );
    }
    else
    {
//
//  Recompute yppi with directed rounding.
//
      fesetround ( FE_UPWARD );
      yppi = y + pi;
          
      if ( yppi <= 0.0 )
      {
        fesetround ( FE_DOWNWARD );
        yppi = y + pi;
      }

      z = std::complex <double> ( x, yppi );
// 
//  Return rounding to default.
//
      fesetround ( FE_TONEAREST );
    }
  }
//
//  Iteration one.
//
  w = s * w;
  r = z - s * w - log ( w );
  wp1 = s * w + 1.0;
  e = r / wp1 * ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - r )
    / ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - 2.0 * r );
  w = w * ( 1.0 + e );
//
//  Iteration two.
//
  if ( abs ( ( 2.0 * w * w - 8.0 * w - 1.0 ) * pow ( abs ( r ), 4.0 ) ) 
    >= TWOITERTOL * 72.0 * pow ( abs ( wp1 ), 6.0 ) )
  {
    r = z - s * w - log ( w );
    wp1 = s * w + 1.0;
    e = r / wp1 * ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - r ) 
      / ( 2.0 * wp1 * ( wp1 + 2.0 / 3.0 * r ) - 2.0 * r );
    w = w * ( 1.0 + e );
  }
//
//  Undo regularization.
//
  w = s * w;
//
//  Provide condition number estimate.
//
  cond = z / ( 1.0 + w );
      
  return 0;
}